

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

uint32 vorbis_find_page(stb_vorbis *f,uint32 *end,uint32 *last)

{
  uint8 *puVar1;
  undefined4 uVar2;
  uint8 uVar3;
  byte bVar4;
  uint loc;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  uint8 header [27];
  
LAB_00177b5e:
  do {
    lVar5 = 1;
    if (f->eof != 0) {
      return 0;
    }
    uVar3 = get8(f);
  } while (uVar3 != 'O');
  loc = stb_vorbis_get_file_offset(f);
  if (f->stream_len < loc - 0x19) {
    return 0;
  }
LAB_00177b92:
  if (lVar5 != 4) goto code_r0x00177b98;
  if (f->eof != 0) {
    return 0;
  }
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    header[lVar5] = ogg_page_header[lVar5];
  }
  for (lVar5 = 4; uVar2 = header._22_4_, lVar5 != 0x1b; lVar5 = lVar5 + 1) {
    uVar3 = get8(f);
    header[lVar5] = uVar3;
  }
  if (f->eof != 0) {
    return 0;
  }
  if (header[4] == '\0') {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      header[lVar5 + 0x16] = '\0';
    }
    uVar6 = 0;
    for (lVar5 = 0; lVar5 != 0x1b; lVar5 = lVar5 + 1) {
      uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)header[lVar5]];
    }
    uVar7 = (uint)header[0x1a];
    iVar8 = 0;
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      bVar4 = get8(f);
      uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar4];
      iVar8 = iVar8 + (uint)bVar4;
    }
    if ((iVar8 != 0) && (f->eof != 0)) {
      return 0;
    }
    while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      bVar4 = get8(f);
      uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar4];
    }
    if (uVar6 == uVar2) {
      if (end != (uint32 *)0x0) {
        uVar6 = stb_vorbis_get_file_offset(f);
        *end = uVar6;
      }
      if (last != (uint32 *)0x0) {
        *last = header[5] >> 2 & 1;
      }
      set_file_offset(f,loc - 1);
      return 1;
    }
  }
  goto LAB_00177cc6;
code_r0x00177b98:
  uVar3 = get8(f);
  puVar1 = ogg_page_header + lVar5;
  lVar5 = lVar5 + 1;
  if (uVar3 != *puVar1) goto code_r0x00177bad;
  goto LAB_00177b92;
code_r0x00177bad:
  if (f->eof != 0) {
    return 0;
  }
LAB_00177cc6:
  set_file_offset(f,loc);
  goto LAB_00177b5e;
}

Assistant:

static uint32 vorbis_find_page(stb_vorbis *f, uint32 *end, uint32 *last)
{
   for(;;) {
      int n;
      if (f->eof) return 0;
      n = get8(f);
      if (n == 0x4f) { // page header candidate
         unsigned int retry_loc = stb_vorbis_get_file_offset(f);
         int i;
         // check if we're off the end of a file_section stream
         if (retry_loc - 25 > f->stream_len)
            return 0;
         // check the rest of the header
         for (i=1; i < 4; ++i)
            if (get8(f) != ogg_page_header[i])
               break;
         if (f->eof) return 0;
         if (i == 4) {
            uint8 header[27];
            uint32 i, crc, goal, len;
            for (i=0; i < 4; ++i)
               header[i] = ogg_page_header[i];
            for (; i < 27; ++i)
               header[i] = get8(f);
            if (f->eof) return 0;
            if (header[4] != 0) goto invalid;
            goal = header[22] + (header[23] << 8) + (header[24]<<16) + ((uint32)header[25]<<24);
            for (i=22; i < 26; ++i)
               header[i] = 0;
            crc = 0;
            for (i=0; i < 27; ++i)
               crc = crc32_update(crc, header[i]);
            len = 0;
            for (i=0; i < header[26]; ++i) {
               int s = get8(f);
               crc = crc32_update(crc, s);
               len += s;
            }
            if (len && f->eof) return 0;
            for (i=0; i < len; ++i)
               crc = crc32_update(crc, get8(f));
            // finished parsing probable page
            if (crc == goal) {
               // we could now check that it's either got the last
               // page flag set, OR it's followed by the capture
               // pattern, but I guess TECHNICALLY you could have
               // a file with garbage between each ogg page and recover
               // from it automatically? So even though that paranoia
               // might decrease the chance of an invalid decode by
               // another 2^32, not worth it since it would hose those
               // invalid-but-useful files?
               if (end)
                  *end = stb_vorbis_get_file_offset(f);
               if (last) {
                  if (header[5] & 0x04)
                     *last = 1;
                  else
                     *last = 0;
               }
               set_file_offset(f, retry_loc-1);
               return 1;
            }
         }
        invalid:
         // not a valid page, so rewind and look for next one
         set_file_offset(f, retry_loc);
      }
   }
}